

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  HttpSocket *pHVar1;
  size_t sVar2;
  undefined1 local_178 [8];
  SocketSet ss;
  string local_138;
  undefined1 local_118 [8];
  POST post;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_51;
  string local_50;
  HttpSocket *local_20;
  HttpDumpSocket *ht;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ht = (HttpDumpSocket *)argv;
  argv_local._0_4_ = argc;
  signal(0xd,(__sighandler_t)0x1);
  minihttp::InitNetwork();
  atexit(minihttp::StopNetwork);
  pHVar1 = (HttpSocket *)operator_new(0x238);
  HttpDumpSocket::HttpDumpSocket((HttpDumpSocket *)pHVar1);
  local_20 = pHVar1;
  minihttp::HttpSocket::SetKeepAlive(pHVar1,3);
  minihttp::TcpSocket::SetBufsizeIn(&local_20->super_TcpSocket,0x10000);
  pHVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"minihttp",&local_51);
  minihttp::HttpSocket::SetUserAgent(pHVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pHVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"example.com",&local_79);
  minihttp::HttpSocket::Download(pHVar1,&local_78,(char *)0x0,(void *)0x0,(POST *)0x0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  pHVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"http://www.ietf.org/rfc/rfc2616.txt",&local_a1);
  minihttp::HttpSocket::Download(pHVar1,&local_a0,(char *)0x0,(void *)0x0,(POST *)0x0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pHVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"https://example.com",&local_c9);
  minihttp::HttpSocket::Download(pHVar1,&local_c8,(char *)0x0,(void *)0x0,(POST *)0x0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pHVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"raw.githubusercontent.com/fgenesis/minihttp/master/minihttp.h",
             (allocator<char> *)(post.data.field_2._M_local_buf + 0xf));
  minihttp::HttpSocket::Download(pHVar1,&local_f0,(char *)0x0,(void *)0x0,(POST *)0x0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)(post.data.field_2._M_local_buf + 0xf));
  minihttp::POST::POST((POST *)local_118);
  minihttp::POST::add((POST *)local_118,"a","b");
  minihttp::POST::add((POST *)local_118,"x","y");
  minihttp::POST::add((POST *)local_118,"long string","possibly invalid data: /x/&$+*#\'?!;");
  minihttp::POST::add((POST *)local_118,"normal","data");
  pHVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"https://httpbin.org/post",
             (allocator<char> *)
             ((long)&ss._store._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  minihttp::HttpSocket::Download(pHVar1,&local_138,(char *)0x0,(void *)0x0,(POST *)local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ss._store._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  minihttp::SocketSet::SocketSet((SocketSet *)local_178);
  minihttp::SocketSet::add((SocketSet *)local_178,&local_20->super_TcpSocket,true);
  while( true ) {
    sVar2 = minihttp::SocketSet::size((SocketSet *)local_178);
    if (sVar2 == 0) break;
    minihttp::SocketSet::update((SocketSet *)local_178);
  }
  argv_local._4_4_ = 0;
  minihttp::SocketSet::~SocketSet((SocketSet *)local_178);
  minihttp::POST::~POST((POST *)local_118);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
#ifdef SIGPIPE
    // On *NIX systems, don't signal writing to a closed socket.
    signal(SIGPIPE, SIG_IGN);
#endif

    // minihttp::Download() in example 1 does this automatically,
    // but if this function is not used this has to be called first to init networking properly.
    minihttp::InitNetwork();
    atexit(minihttp::StopNetwork);

    HttpDumpSocket *ht = new HttpDumpSocket;
    ht->SetKeepAlive(3);
    ht->SetBufsizeIn(64 * 1024);
    ht->SetUserAgent("minihttp"); // Let the server know who we are. This is optional but it seems that some servers check that this is set.

    // HTTP GET
    ht->Download("example.com");
    ht->Download("http://www.ietf.org/rfc/rfc2616.txt");
    // Downloads requested in succession will be queued and processed one after another

    // HTTP GET with SSL, if SSL support is enabled:
    ht->Download("https://example.com"); // SSL connection
    ht->Download("raw.githubusercontent.com/fgenesis/minihttp/master/minihttp.h"); // transparent HTTP -> HTTPS redirection

    // Example HTTP POST request:
    minihttp::POST post;
    post.add("a", "b");
    post.add("x", "y");
    post.add("long string", "possibly invalid data: /x/&$+*#'?!;");
    post.add("normal", "data");
    ht->Download("https://httpbin.org/post", NULL, NULL, &post);

    minihttp::SocketSet ss;

    ss.add(ht, true); // true: Delete socket if closed and no task left.

    // This is non-blocking and could be done in background or by another thread.
    // Hogs quite some CPU doing it this way, though.
    while(ss.size())
        ss.update();

    return 0;
}